

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void propagatemark(global_State *g)

{
  lua_State *L;
  GCObject *pGVar1;
  CallInfo *pCVar2;
  lua_CFunction p_Var3;
  bool bVar4;
  lua_Alloc *pp_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  uint uVar10;
  int iVar11;
  TValue *pTVar12;
  StkId pTVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  StkId pTVar17;
  ulong uVar18;
  Table *events;
  ulong uVar19;
  global_State *pgVar20;
  CClosure *cl;
  GCObject **ppGVar21;
  StkId pTVar22;
  long lVar23;
  int *piVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  
  L = (lua_State *)g->gray;
  bVar9 = L->marked;
  L->marked = bVar9 | 4;
  switch(L->tt) {
  case '\x05':
    g->gray = (GCObject *)L->stack_last;
    events = (Table *)L->oldpc;
    if (events == (Table *)0x0) {
LAB_0010e57f:
      pgVar20 = L->l_G;
      bVar9 = *(byte *)((long)&L->nci + 1);
      pp_Var5 = &pgVar20->frealloc;
      uVar10 = *(uint *)&L->status;
      if (uVar10 != 0) {
        lVar16 = 8;
        uVar19 = 0;
        do {
          if (((*(byte *)((long)&L->top->value_ + lVar16) & 0x40) != 0) &&
             (pGVar1 = *(GCObject **)((long)L->top + lVar16 + -8), (pGVar1->marked & 3) != 0)) {
            reallymarkobject(g,pGVar1);
            uVar10 = *(uint *)&L->status;
          }
          uVar19 = uVar19 + 1;
          lVar16 = lVar16 + 0x10;
        } while (uVar19 < uVar10);
        pgVar20 = L->l_G;
      }
      for (; pgVar20 < (global_State *)(pp_Var5 + (long)(1 << (bVar9 & 0x1f)) * 4);
          pgVar20 = (global_State *)&pgVar20->GCmemtrav) {
        uVar10 = *(uint *)&pgVar20->ud;
        if (uVar10 == 0) {
          if (((pgVar20->GCdebt & 0x40) != 0) && ((*(byte *)(pgVar20->totalbytes + 9) & 3) != 0)) {
            *(undefined4 *)&pgVar20->GCdebt = 10;
          }
        }
        else {
          if (((pgVar20->GCdebt & 0x40) != 0) &&
             ((((GCObject *)pgVar20->totalbytes)->marked & 3) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar20->totalbytes);
            uVar10 = *(uint *)&pgVar20->ud;
          }
          if (((uVar10 & 0x40) != 0) && ((((GCObject *)pgVar20->frealloc)->marked & 3) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar20->frealloc);
          }
        }
      }
    }
    else {
      if ((events->flags & 8) == 0) {
        pTVar12 = luaT_gettm(events,TM_MODE,g->tmname[3]);
        events = (Table *)L->oldpc;
        if (events != (Table *)0x0) goto LAB_0010e506;
      }
      else {
        pTVar12 = (TValue *)0x0;
LAB_0010e506:
        if ((events->marked & 3) != 0) {
          reallymarkobject(g,(GCObject *)events);
        }
      }
      if ((pTVar12 == (TValue *)0x0) || ((pTVar12->tt_ & 0xfU) != 4)) goto LAB_0010e57f;
      p_Var3 = (pTVar12->value_).f;
      pcVar14 = strchr((char *)(p_Var3 + 0x18),0x6b);
      pcVar15 = strchr((char *)(p_Var3 + 0x18),0x76);
      if (pcVar14 == (char *)0x0 && pcVar15 == (char *)0x0) goto LAB_0010e57f;
      L->marked = L->marked & 0xfb;
      if (pcVar14 == (char *)0x0) {
        bVar9 = *(byte *)((long)&L->nci + 1);
        bVar25 = *(int *)&L->status != 0;
        if (bVar9 != 0x1f) {
          pgVar20 = L->l_G;
          pp_Var5 = &pgVar20->frealloc;
          do {
            if (*(int *)&pgVar20->ud == 0) {
              if (((pgVar20->GCdebt & 0x40) != 0) && ((*(byte *)(pgVar20->totalbytes + 9) & 3) != 0)
                 ) {
                *(undefined4 *)&pgVar20->GCdebt = 10;
              }
            }
            else {
              if (((pgVar20->GCdebt & 0x40) != 0) &&
                 ((((GCObject *)pgVar20->totalbytes)->marked & 3) != 0)) {
                reallymarkobject(g,(GCObject *)pgVar20->totalbytes);
              }
              bVar4 = !bVar25;
              bVar25 = true;
              if (bVar4) {
                iVar11 = iscleared(g,(TValue *)pgVar20);
                bVar25 = iVar11 != 0;
              }
            }
            pgVar20 = (global_State *)&pgVar20->GCmemtrav;
          } while (pgVar20 < pp_Var5 + (long)(1 << (bVar9 & 0x1f)) * 4);
        }
        if (g->gcstate == '\0') {
          lVar16 = 0x78;
        }
        else {
          lVar16 = 0x80;
          if (!bVar25) goto LAB_0010e648;
        }
        L->stack_last = *(StkId *)((long)&g->frealloc + lVar16);
        *(lua_State **)((long)&g->frealloc + lVar16) = L;
      }
      else if (pcVar15 == (char *)0x0) {
        traverseephemeron(g,(Table *)L);
      }
      else {
        L->stack_last = (StkId)g->allweak;
        g->allweak = (GCObject *)L;
      }
    }
LAB_0010e648:
    if (L->ci == (CallInfo *)0x0) {
      lVar16 = 0;
    }
    else {
      lVar16 = (long)(1 << (*(byte *)((long)&L->nci + 1) & 0x1f)) << 5;
    }
    lVar16 = lVar16 + (ulong)*(uint *)&L->status * 0x10 + 0x38;
    break;
  case '\x06':
    g->gray = (GCObject *)L->top;
    pgVar20 = L->l_G;
    if ((pgVar20 != (global_State *)0x0) && (((ulong)pgVar20->ud & 0x300) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar20);
    }
    if ((char)L->nci == '\0') {
LAB_0010e367:
      lVar16 = 0x20;
    }
    else {
      uVar19 = 0;
      do {
        pCVar2 = (&L->ci)[uVar19];
        if (pCVar2 != (CallInfo *)0x0) {
          pTVar22 = pCVar2->func;
          if ((pTVar22 == (StkId)&pCVar2->previous) || (g->gcstate == '\b')) {
            if (((pTVar22->tt_ & 0x40) != 0) && ((((pTVar22->value_).gc)->marked & 3) != 0)) {
              reallymarkobject(g,(pTVar22->value_).gc);
            }
          }
          else {
            *(undefined4 *)&pCVar2->next = 1;
          }
        }
        uVar19 = uVar19 + 1;
        uVar18 = (ulong)(byte)L->nci;
      } while (uVar19 < uVar18);
      lVar16 = uVar18 * 8 + 0x20;
    }
    break;
  case '\a':
    goto switchD_0010e09e_caseD_7;
  case '\b':
    g->gray = L->gclist;
    L->gclist = g->grayagain;
    g->grayagain = (GCObject *)L;
    L->marked = bVar9 & 0xfb;
    pTVar22 = L->stack;
    if (pTVar22 == (StkId)0x0) {
      lVar16 = 1;
    }
    else {
      pTVar13 = L->top;
      for (; auVar8 = _DAT_00124330, auVar7 = _DAT_00124320, auVar6 = _DAT_00124310,
          pTVar22 < pTVar13; pTVar22 = pTVar22 + 1) {
        if (((pTVar22->tt_ & 0x40) != 0) && ((((pTVar22->value_).gc)->marked & 3) != 0)) {
          reallymarkobject(g,(pTVar22->value_).gc);
          pTVar13 = L->top;
        }
      }
      if (g->gcstate == '\b') {
        pTVar13 = L->stack + L->stacksize;
        if (pTVar22 < pTVar13) {
          pTVar17 = pTVar22 + 1;
          if (pTVar22 + 1 < pTVar13) {
            pTVar17 = pTVar13;
          }
          uVar19 = (long)&pTVar17->value_ + ~(ulong)pTVar22;
          auVar28._8_4_ = (int)uVar19;
          auVar28._0_8_ = uVar19;
          auVar28._12_4_ = (int)(uVar19 >> 0x20);
          auVar26._0_8_ = uVar19 >> 4;
          auVar26._8_8_ = auVar28._8_8_ >> 4;
          piVar24 = &pTVar22[3].tt_;
          uVar18 = 0;
          auVar26 = auVar26 ^ _DAT_00124330;
          do {
            auVar27._8_4_ = (int)uVar18;
            auVar27._0_8_ = uVar18;
            auVar27._12_4_ = (int)(uVar18 >> 0x20);
            auVar28 = (auVar27 | auVar7) ^ auVar8;
            iVar11 = auVar26._4_4_;
            if ((bool)(~(auVar28._4_4_ == iVar11 && auVar26._0_4_ < auVar28._0_4_ ||
                        iVar11 < auVar28._4_4_) & 1)) {
              piVar24[-0xc] = 0;
            }
            if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
                auVar28._12_4_ <= auVar26._12_4_) {
              piVar24[-8] = 0;
            }
            auVar28 = (auVar27 | auVar6) ^ auVar8;
            iVar29 = auVar28._4_4_;
            if (iVar29 <= iVar11 && (iVar29 != iVar11 || auVar28._0_4_ <= auVar26._0_4_)) {
              piVar24[-4] = 0;
              *piVar24 = 0;
            }
            uVar18 = uVar18 + 4;
            piVar24 = piVar24 + 0x10;
          } while (((uVar19 >> 4) + 4 & 0xfffffffffffffffc) != uVar18);
        }
        if ((L->twups == L) && (L->openupval != (UpVal *)0x0)) {
          L->twups = g->twups;
          g->twups = L;
        }
      }
      else if (g->gckind != '\x01') {
        luaD_shrinkstack(L);
      }
      lVar16 = (long)L->stacksize * 0x10 + (ulong)L->nci * 0x48 + 0xd0;
    }
    break;
  case '\t':
    g->gray = (GCObject *)(L->base_ci).previous;
    pTVar22 = (L->base_ci).func;
    if ((pTVar22 != (StkId)0x0) && ((pTVar22->tt_ & 0x300) != 0)) {
      (L->base_ci).func = (StkId)0x0;
    }
    pGVar1 = (GCObject *)(L->base_ci).top;
    if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 3) != 0)) {
      reallymarkobject(g,pGVar1);
    }
    iVar11 = *(int *)((long)&L->top + 4);
    if (0 < iVar11) {
      lVar23 = 8;
      lVar16 = 0;
      do {
        if (((*(byte *)((long)&L->stack_last->value_ + lVar23) & 0x40) != 0) &&
           (pGVar1 = *(GCObject **)((long)L->stack_last + lVar23 + -8), (pGVar1->marked & 3) != 0))
        {
          reallymarkobject(g,pGVar1);
          iVar11 = *(int *)((long)&L->top + 4);
        }
        lVar16 = lVar16 + 1;
        lVar23 = lVar23 + 0x10;
      } while (lVar16 < iVar11);
    }
    iVar11 = *(int *)&L->top;
    if (0 < iVar11) {
      lVar23 = 0;
      lVar16 = 0;
      do {
        pGVar1 = *(GCObject **)((long)L->errorJmp->b[0].__jmpbuf + lVar23 + -8);
        if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 3) != 0)) {
          reallymarkobject(g,pGVar1);
          iVar11 = *(int *)&L->top;
        }
        lVar16 = lVar16 + 1;
        lVar23 = lVar23 + 0x10;
      } while (lVar16 < iVar11);
    }
    iVar11 = *(int *)&L->ci;
    if (0 < iVar11) {
      lVar16 = 0;
      do {
        pGVar1 = (GCObject *)(&L->openupval->v)[lVar16];
        if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 3) != 0)) {
          reallymarkobject(g,pGVar1);
          iVar11 = *(int *)&L->ci;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar11);
    }
    iVar29 = *(int *)((long)&L->ci + 4);
    if (0 < iVar29) {
      lVar23 = 0;
      lVar16 = 0;
      do {
        pGVar1 = *(GCObject **)((long)&L->twups->next + lVar23);
        if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 3) != 0)) {
          reallymarkobject(g,pGVar1);
          iVar29 = *(int *)((long)&L->ci + 4);
        }
        lVar16 = lVar16 + 1;
        lVar23 = lVar23 + 0x10;
      } while (lVar16 < iVar29);
      iVar11 = *(int *)&L->ci;
    }
    lVar16 = (long)((iVar29 + *(int *)((long)&L->top + 4) + *(int *)&L->top) * 0x10 +
                    (*(int *)((long)&L->l_G + 4) + *(int *)&L->l_G) * 4 + iVar11 * 8 + 0x78);
    break;
  default:
    if (L->tt != '&') {
      return;
    }
    g->gray = (GCObject *)L->top;
    bVar9 = (byte)L->nci;
    if (bVar9 == 0) goto LAB_0010e367;
    ppGVar21 = (GCObject **)&L->oldpc;
    uVar19 = 0;
    do {
      if ((((ulong)*ppGVar21 & 0x40) != 0) &&
         (((ulong)((CallInfo *)ppGVar21[-1])->top & 0x300) != 0)) {
        reallymarkobject(g,ppGVar21[-1]);
        bVar9 = (byte)L->nci;
      }
      uVar19 = uVar19 + 1;
      ppGVar21 = ppGVar21 + 2;
    } while (uVar19 < bVar9);
    lVar16 = (ulong)bVar9 * 0x10 + 0x20;
  }
  g->GCmemtrav = g->GCmemtrav + lVar16;
switchD_0010e09e_caseD_7:
  return;
}

Assistant:

static void propagatemark(global_State *g) {
    lu_mem size;
    GCObject *o = g->gray;
    lua_assert(isgray(o));
    gray2black(o);
    switch (o->tt) {
        case LUA_TTABLE: {
            Table *h = gco2t(o);
            g->gray = h->gclist;  /* remove from 'gray' list */
            size = traversetable(g, h);
            break;
        }
        case LUA_TLCL: {
            LClosure *cl = gco2lcl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseLclosure(g, cl);
            break;
        }
        case LUA_TCCL: {
            CClosure *cl = gco2ccl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseCclosure(g, cl);
            break;
        }
        case LUA_TTHREAD: {
            lua_State *th = gco2th(o);
            g->gray = th->gclist;  /* remove from 'gray' list */
            linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
            black2gray(o);
            size = traversethread(g, th);
            break;
        }
        case LUA_TPROTO: {
            Proto *p = gco2p(o);
            g->gray = p->gclist;  /* remove from 'gray' list */
            size = traverseproto(g, p);
            break;
        }
        default:
            lua_assert(0);
            return;
    }
    g->GCmemtrav += size;
}